

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O1

uint addChunk_IHDR(ucvector *out,uint w,uint h,LodePNGColorType colortype,uint bitdepth,
                  uint interlace_method)

{
  uint uVar1;
  uchar *chunk;
  uchar *local_30;
  
  uVar1 = lodepng_chunk_init(&local_30,out,0xd,"IHDR");
  if (uVar1 == 0) {
    local_30[8] = (uchar)(w >> 0x18);
    local_30[9] = (uchar)(w >> 0x10);
    local_30[10] = (uchar)(w >> 8);
    local_30[0xb] = (uchar)w;
    local_30[0xc] = (uchar)(h >> 0x18);
    local_30[0xd] = (uchar)(h >> 0x10);
    local_30[0xe] = (uchar)(h >> 8);
    local_30[0xf] = (uchar)h;
    local_30[0x10] = (uchar)bitdepth;
    local_30[0x11] = (uchar)colortype;
    local_30[0x12] = '\0';
    local_30[0x13] = '\0';
    local_30[0x14] = (uchar)interlace_method;
    lodepng_chunk_generate_crc(local_30);
    uVar1 = 0;
  }
  return uVar1;
}

Assistant:

static unsigned addChunk_IHDR(ucvector* out, unsigned w, unsigned h,
                              LodePNGColorType colortype, unsigned bitdepth, unsigned interlace_method) {
  unsigned char *chunk, *data;
  CERROR_TRY_RETURN(lodepng_chunk_init(&chunk, out, 13, "IHDR"));
  data = chunk + 8;

  lodepng_set32bitInt(data + 0, w); /*width*/
  lodepng_set32bitInt(data + 4, h); /*height*/
  data[8] = (unsigned char)bitdepth; /*bit depth*/
  data[9] = (unsigned char)colortype; /*color type*/
  data[10] = 0; /*compression method*/
  data[11] = 0; /*filter method*/
  data[12] = interlace_method; /*interlace method*/

  lodepng_chunk_generate_crc(chunk);
  return 0;
}